

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O2

void CPU::WDC65816::ProcessorStorageConstructor::stp_wai
               (AccessType param_1,bool param_2,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,OperationPerform);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchPCThrowaway);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchPCThrowaway);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleRepeatingNone);
  return;
}

Assistant:

static void stp_wai(AccessType, bool, const std::function<void(MicroOp)> &target) {
		target(OperationPerform);			// Establishes the termination condition.
		target(CycleFetchPCThrowaway);		// IO.
		target(CycleFetchPCThrowaway);		// IO.
		target(CycleRepeatingNone);			// This will first check whether the STP/WAI exit
											// condition has occurred; if not then it'll issue
											// either a BusOperation::None or ::Ready and then
											// reschedule itself.
	}